

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uchar *input,uchar *output)

{
  mbedtls_mpi *Y;
  mbedtls_mpi *X;
  mbedtls_mpi *G;
  _func_int_void_ptr_uchar_ptr_size_t *p_Var1;
  int iVar2;
  int iVar3;
  mbedtls_mpi T;
  mbedtls_mpi T1;
  mbedtls_mpi T2;
  mbedtls_mpi local_88;
  _func_int_void_ptr_uchar_ptr_size_t *local_70;
  mbedtls_mpi local_68;
  uchar *local_50;
  mbedtls_mpi local_48;
  
  mbedtls_mpi_init(&local_88);
  mbedtls_mpi_init(&local_68);
  mbedtls_mpi_init(&local_48);
  iVar2 = mbedtls_mpi_read_binary(&local_88,input,ctx->len);
  if (iVar2 == 0) {
    Y = &ctx->N;
    local_70 = f_rng;
    iVar3 = mbedtls_mpi_cmp_mpi(&local_88,Y);
    iVar2 = -4;
    if (iVar3 < 0) {
      if (local_70 != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
        X = &ctx->Vf;
        G = &ctx->Vi;
        if ((ctx->Vf).p == (mbedtls_mpi_uint *)0x0) {
          iVar3 = 0xc;
          local_50 = output;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              iVar2 = -0x4480;
              goto LAB_0017251d;
            }
            iVar2 = mbedtls_mpi_fill_random(X,ctx->len - 1,local_70,p_rng);
            if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_gcd(G,X,Y), iVar2 != 0)) goto LAB_0017251d;
            iVar2 = mbedtls_mpi_cmp_int(G,1);
          } while (iVar2 != 0);
          iVar2 = mbedtls_mpi_inv_mod(G,X,Y);
          output = local_50;
          if (iVar2 != 0) goto LAB_0017251d;
          iVar2 = mbedtls_mpi_exp_mod(G,G,&ctx->E,Y,&ctx->RN);
        }
        else {
          iVar2 = mbedtls_mpi_mul_mpi(G,G,G);
          if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_mod_mpi(G,G,Y), iVar2 != 0)) ||
             (iVar2 = mbedtls_mpi_mul_mpi(X,X,X), iVar2 != 0)) goto LAB_0017251d;
          iVar2 = mbedtls_mpi_mod_mpi(X,X,Y);
        }
        if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_mul_mpi(&local_88,&local_88,G), iVar2 != 0)) ||
           (iVar2 = mbedtls_mpi_mod_mpi(&local_88,&local_88,Y), iVar2 != 0)) goto LAB_0017251d;
      }
      p_Var1 = local_70;
      iVar2 = mbedtls_mpi_exp_mod(&local_68,&local_88,&ctx->DP,&ctx->P,&ctx->RP);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_exp_mod(&local_48,&local_88,&ctx->DQ,&ctx->Q,&ctx->RQ);
        if ((((iVar2 == 0) &&
             (iVar2 = mbedtls_mpi_sub_mpi(&local_88,&local_68,&local_48), iVar2 == 0)) &&
            ((iVar2 = mbedtls_mpi_mul_mpi(&local_68,&local_88,&ctx->QP), iVar2 == 0 &&
             (((iVar2 = mbedtls_mpi_mod_mpi(&local_88,&local_68,&ctx->P), iVar2 == 0 &&
               (iVar2 = mbedtls_mpi_mul_mpi(&local_68,&local_88,&ctx->Q), iVar2 == 0)) &&
              (iVar2 = mbedtls_mpi_add_mpi(&local_88,&local_48,&local_68), iVar2 == 0)))))) &&
           ((p_Var1 == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
            ((iVar2 = mbedtls_mpi_mul_mpi(&local_88,&local_88,&ctx->Vf), iVar2 == 0 &&
             (iVar2 = mbedtls_mpi_mod_mpi(&local_88,&local_88,Y), iVar2 == 0)))))) {
          iVar2 = mbedtls_mpi_write_binary(&local_88,output,ctx->len);
        }
      }
    }
  }
LAB_0017251d:
  mbedtls_mpi_free(&local_88);
  mbedtls_mpi_free(&local_68);
  mbedtls_mpi_free(&local_48);
  iVar3 = iVar2 + -0x4300;
  if (iVar2 == 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_private( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 const unsigned char *input,
                 unsigned char *output )
{
    int ret;
    size_t olen;
    mbedtls_mpi T, T1, T2;

    mbedtls_mpi_init( &T ); mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &T, input, ctx->len ) );
    if( mbedtls_mpi_cmp_mpi( &T, &ctx->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( f_rng != NULL )
    {
        /*
         * Blinding
         * T = T * Vi mod N
         */
        MBEDTLS_MPI_CHK( rsa_prepare_blinding( ctx, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );
    }

#if defined(MBEDTLS_RSA_NO_CRT)
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T, &T, &ctx->D, &ctx->N, &ctx->RN ) );
#else
    /*
     * faster decryption using the CRT
     *
     * T1 = input ^ dP mod P
     * T2 = input ^ dQ mod Q
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T1, &T, &ctx->DP, &ctx->P, &ctx->RP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T2, &T, &ctx->DQ, &ctx->Q, &ctx->RQ ) );

    /*
     * T = (T1 - T2) * (Q^-1 mod P) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T, &T1, &T2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1, &T, &ctx->QP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T1, &ctx->P ) );

    /*
     * T = T2 + T * Q
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1, &T, &ctx->Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &T, &T2, &T1 ) );
#endif /* MBEDTLS_RSA_NO_CRT */

    if( f_rng != NULL )
    {
        /*
         * Unblind
         * T = T * Vf mod N
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &T, output, olen ) );

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    mbedtls_mpi_free( &T ); mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_PRIVATE_FAILED + ret );

    return( 0 );
}